

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmrun.cpp
# Opt level: O0

void __thiscall CVmRun::makelstpar(CVmRun *this)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  vm_val_t *in_RDI;
  uint i;
  uint hdr_depth;
  CVmFuncPtr hdr_ptr;
  int lstcnt;
  vm_val_t val2;
  vm_val_t val;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  CVmFuncPtr in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  vm_val_t *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  
  popval((CVmRun *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
  pop_int((CVmRun *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
  iVar1 = vm_val_t::is_listlike
                    ((vm_val_t *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
  if ((iVar1 == 0) ||
     (iVar1 = vm_val_t::ll_length((vm_val_t *)in_stack_ffffffffffffffc8.p_), iVar1 < 0)) {
    pushval((CVmRun *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
    pushval((CVmRun *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),in_RDI);
  }
  else {
    CVmFuncPtr::CVmFuncPtr((CVmFuncPtr *)&stack0xffffffffffffffc8);
    CVmFuncPtr::set((CVmFuncPtr *)&stack0xffffffffffffffc8,entry_ptr_native_);
    uVar2 = CVmFuncPtr::get_stack_depth((CVmFuncPtr *)0x22f49d);
    iVar3 = CVmStack::get_depth_rel(frame_ptr_);
    uVar4 = uVar2 - (iVar3 + -1);
    iVar5 = CVmStack::check_space
                      ((CVmStack *)CONCAT44(uVar4,in_stack_ffffffffffffffc0),
                       (int)((ulong)in_RDI >> 0x20));
    iVar3 = iVar1;
    if (iVar5 == 0) {
      err_throw(0);
    }
    for (; iVar1 != 0; iVar1 = iVar1 + -1) {
      CVmStack::push();
      vm_val_t::ll_index((vm_val_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                         in_stack_ffffffffffffffd8,iVar3);
    }
    pushval((CVmRun *)((ulong)uVar4 << 0x20),in_RDI);
  }
  return;
}

Assistant:

void CVmRun::makelstpar(VMG0_)
{
    /* pop the value and the argument counter so far */
    vm_val_t val, val2;
    popval(vmg_ &val);
    pop_int(vmg_ &val2);
    
    /* if it's not a list, just push it again unchanged */
    int lstcnt;
    if (!val.is_listlike(vmg0_)
        || (lstcnt = val.ll_length(vmg0_)) < 0)
    {
        /* put it back on the stack */
        pushval(vmg_ &val);
        
        /* increment the argument count and push it */
        ++val2.val.intval;
        pushval(vmg_ &val2);
        
        /* our work here is done */
        return;
    }

    /* set up a pointer to the current function header */
    CVmFuncPtr hdr_ptr;
    hdr_ptr.set(entry_ptr_native_);

    /* get the depth required for the header */
    uint hdr_depth = hdr_ptr.get_stack_depth();
    
    /* 
     *   deduct the amount stack space we've already used from the amount
     *   noted in the header, because that's the amount more that we could
     *   need for the fixed stuff
     */
    hdr_depth -= (get_depth_rel(frame_ptr_) - 1);
    
    /* make sure we have enough stack space available */
    if (!check_space(lstcnt + hdr_depth))
        err_throw(VMERR_STACK_OVERFLOW);
    
    /* push the elements of the list from last to first */
    for (uint i = lstcnt ; i != 0 ; --i)
    {
        /* push this element's value */
        val.ll_index(vmg_ push(), i);
    }

    /* increment and push the argument count */
    val2.val.intval += lstcnt;
    pushval(vmg_ &val2);
}